

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O0

void NHandyPack::
     TSetSerializer<std::unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>,_wchar_t>
     ::Load(istream *in,
           unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
           *object)

{
  wchar_t local_2c;
  ulong uStack_28;
  wchar_t obj;
  size_t i;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *puStack_18;
  uint32_t size;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *object_local;
  istream *in_local;
  
  puStack_18 = object;
  object_local = (unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
                  *)in;
  std::istream::read((char *)in,(long)&i + 4);
  std::unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  ::clear(puStack_18);
  for (uStack_28 = 0; uStack_28 < i._4_4_; uStack_28 = uStack_28 + 1) {
    Load<wchar_t>((istream *)object_local,&local_2c);
    std::
    unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>::
    insert(puStack_18,&local_2c);
  }
  return;
}

Assistant:

static inline void Load(std::istream& in, TVec& object) {
        uint32_t size;
        in.read((char*)(&size), sizeof(size));
        object.clear();
        for (size_t i = 0; i < size; ++i) {
            TObj obj;
            NHandyPack::Load(in, obj);
            object.insert(std::move(obj));
        }
    }